

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQuerySurfaceTests.cpp
# Opt level: O3

int __thiscall deqp::egl::QuerySurfaceTests::init(QuerySurfaceTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  SimpleConfigCase *pSVar4;
  pointer pNVar5;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> filterLists;
  FilterList baseFilters;
  vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_> local_68;
  FilterList local_48;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"simple",
             "Simple queries");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"window",
             "Window surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<4u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb320;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pixmap",
             "Pixmap surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<2u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb378;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pbuffer",
             "Pbuffer surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<1u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb3d0;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "set_attribute","Setting attributes");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"window",
             "Window surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<4u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb428;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pixmap",
             "Pixmap surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<2u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb480;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"pbuffer",
             "Pbuffer surfaces");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_rules.
  super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  eglu::FilterList::operator<<(&local_48,surfaceType<1u>);
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getDefaultFilterLists(&local_68,&local_48);
  pNVar5 = local_68.
           super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pSVar4 = (SimpleConfigCase *)operator_new(0xb8);
      SimpleConfigCase::SimpleConfigCase
                (pSVar4,(this->super_TestCaseGroup).m_eglTestCtx,(pNVar5->m_name)._M_dataplus._M_p,
                 (pNVar5->m_description)._M_dataplus._M_p,&pNVar5->super_FilterList);
      (pSVar4->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__SimpleConfigCase_003eb4d8;
      tcu::TestNode::addChild(pTVar3,(TestNode *)pSVar4);
      pNVar5 = pNVar5 + 1;
    } while (pNVar5 != local_68.
                       super__Vector_base<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::vector<deqp::egl::NamedFilterList,_std::allocator<deqp::egl::NamedFilterList>_>::~vector
            (&local_68);
  iVar1 = extraout_EAX;
  if (local_48.m_rules.
      super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_rules.
                    super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_rules.
                          super__Vector_base<bool_(*)(const_eglu::CandidateConfig_&),_std::allocator<bool_(*)(const_eglu::CandidateConfig_&)>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

void QuerySurfaceTests::init (void)
{
	// Simple queries
	{
		tcu::TestCaseGroup* simpleGroup = new tcu::TestCaseGroup(m_testCtx, "simple", "Simple queries");
		addChild(simpleGroup);

		// Window
		{
			tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "window", "Window surfaces");
			simpleGroup->addChild(windowGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_WINDOW_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				windowGroup->addChild(new QuerySurfaceSimpleWindowCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pixmap
		{
			tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "pixmap", "Pixmap surfaces");
			simpleGroup->addChild(pixmapGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pixmapGroup->addChild(new QuerySurfaceSimplePixmapCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pbuffer
		{
			tcu::TestCaseGroup* pbufferGroup = new tcu::TestCaseGroup(m_testCtx, "pbuffer", "Pbuffer surfaces");
			simpleGroup->addChild(pbufferGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pbufferGroup->addChild(new QuerySurfaceSimplePbufferCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}
	}

	// Set surface attributes
	{
		tcu::TestCaseGroup* setAttributeGroup = new tcu::TestCaseGroup(m_testCtx, "set_attribute", "Setting attributes");
		addChild(setAttributeGroup);

		// Window
		{
			tcu::TestCaseGroup* windowGroup = new tcu::TestCaseGroup(m_testCtx, "window", "Window surfaces");
			setAttributeGroup->addChild(windowGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_WINDOW_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				windowGroup->addChild(new SurfaceAttribWindowCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pixmap
		{
			tcu::TestCaseGroup* pixmapGroup = new tcu::TestCaseGroup(m_testCtx, "pixmap", "Pixmap surfaces");
			setAttributeGroup->addChild(pixmapGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PIXMAP_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pixmapGroup->addChild(new SurfaceAttribPixmapCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}

		// Pbuffer
		{
			tcu::TestCaseGroup* pbufferGroup = new tcu::TestCaseGroup(m_testCtx, "pbuffer", "Pbuffer surfaces");
			setAttributeGroup->addChild(pbufferGroup);

			eglu::FilterList baseFilters;
			baseFilters << surfaceType<EGL_PBUFFER_BIT>;

			std::vector<NamedFilterList> filterLists;
			getDefaultFilterLists(filterLists, baseFilters);

			for (std::vector<NamedFilterList>::iterator i = filterLists.begin(); i != filterLists.end(); i++)
				pbufferGroup->addChild(new SurfaceAttribPbufferCase(m_eglTestCtx, i->getName(), i->getDescription(), *i));
		}
	}
}